

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

JavascriptString *
Js::RegexHelper::AppendStickyToFlagsIfNeeded(JavascriptString *flags,ScriptContext *scriptContext)

{
  charcount_t cVar1;
  char16 *pcVar2;
  char16_t *pcVar3;
  TempArenaAllocatorObject *this;
  ArenaAllocator *alloc;
  undefined1 local_68 [8];
  StringBuilder<Memory::ArenaAllocator> bs;
  ArenaAllocator *tempAlloc;
  TempArenaAllocatorObject *temptempAlloc;
  char16 *flagsString;
  ScriptContext *scriptContext_local;
  JavascriptString *flags_local;
  
  pcVar2 = JavascriptString::GetString(flags);
  pcVar3 = PAL_wcsstr(pcVar2,L"y");
  scriptContext_local = (ScriptContext *)flags;
  if (pcVar3 == (char16_t *)0x0) {
    this = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexHelper");
    alloc = TempArenaAllocatorWrapper<false>::GetAllocator(this);
    bs._48_8_ = alloc;
    cVar1 = JavascriptString::GetLength(flags);
    StringBuilder<Memory::ArenaAllocator>::StringBuilder
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,alloc,cVar1 + 1);
    cVar1 = JavascriptString::GetLength(flags);
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,pcVar2,cVar1);
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L'y');
    pcVar2 = StringBuilder<Memory::ArenaAllocator>::Detach
                       ((StringBuilder<Memory::ArenaAllocator> *)local_68);
    cVar1 = StringBuilder<Memory::ArenaAllocator>::Count
                      ((StringBuilder<Memory::ArenaAllocator> *)local_68);
    scriptContext_local =
         (ScriptContext *)JavascriptString::NewCopyBuffer(pcVar2,cVar1,scriptContext);
    ScriptContext::ReleaseTemporaryAllocator(scriptContext,this);
  }
  return (JavascriptString *)scriptContext_local;
}

Assistant:

JavascriptString* RegexHelper::AppendStickyToFlagsIfNeeded(JavascriptString* flags, ScriptContext* scriptContext)
    {
        const char16* flagsString = flags->GetString();
        if (wcsstr(flagsString, _u("y")) == nullptr)
        {
            BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("RegexHelper"))
            {
                StringBuilder<ArenaAllocator> bs(tempAlloc, flags->GetLength() + 1);
                bs.Append(flagsString, flags->GetLength());
                bs.Append(_u('y'));
                flags = Js::JavascriptString::NewCopyBuffer(bs.Detach(), bs.Count(), scriptContext);
            }
            END_TEMP_ALLOCATOR(tempAlloc, scriptContext);
        }

        return flags;
    }